

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::HandleCommandLineArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errormsg)

{
  cmCTestTestHandler *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  long lVar6;
  char *pcVar7;
  mapped_type *ppcVar8;
  ostream *poVar9;
  size_type sVar10;
  cmCTestGenericHandler *pcVar11;
  allocator local_939;
  string local_938;
  allocator local_911;
  string local_910;
  allocator local_8e9;
  string local_8e8;
  allocator local_8c1;
  string local_8c0;
  allocator local_899;
  string local_898;
  allocator local_871;
  string local_870;
  allocator local_849;
  string local_848;
  allocator local_821;
  string local_820;
  allocator local_7f9;
  string local_7f8;
  allocator local_7d1;
  string local_7d0;
  allocator local_7a9;
  string local_7a8;
  allocator local_781;
  string local_780;
  allocator local_759;
  string local_758;
  allocator local_731;
  string local_730;
  allocator local_709;
  string local_708;
  allocator local_6e1;
  string local_6e0;
  allocator local_6b9;
  string local_6b8;
  allocator local_691;
  string local_690;
  allocator local_669;
  string local_668;
  allocator local_641;
  string local_640;
  string local_620 [32];
  undefined1 local_600 [8];
  ostringstream cmCTestLog_msg_2;
  allocator local_481;
  key_type local_480;
  cmCTestTestHandler *local_460;
  cmCTestTestHandler *pCTestTestHandler_1;
  long outputSize_1;
  undefined1 local_430 [8];
  ostringstream cmCTestLog_msg_1;
  allocator local_2b1;
  key_type local_2b0;
  cmCTestTestHandler *local_290;
  cmCTestTestHandler *pCTestTestHandler;
  long outputSize;
  double timeout;
  undefined1 local_258 [8];
  ostringstream cmCTestLog_msg;
  unsigned_long local_e0;
  unsigned_long load;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long local_98;
  long repeat;
  string local_88 [36];
  int local_64;
  int local_60;
  int plevel_1;
  int plevel;
  undefined1 local_50 [8];
  string arg;
  string *errormsg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  cmCTest *this_local;
  
  arg.field_2._8_8_ = errormsg;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,*i);
  std::__cxx11::string::string((string *)local_50,(string *)pvVar5);
  bVar3 = CheckArgument(this,(string *)local_50,"-F",(char *)0x0);
  if (bVar3) {
    this->Failover = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-j","--parallel");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    local_60 = atoi(pcVar7);
    SetParallelLevel(this,local_60);
    this->ParallelLevelSetInCli = true;
  }
  else {
    lVar6 = std::__cxx11::string::find(local_50,0xb98106);
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)local_88,(ulong)local_50);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar4 = atoi(pcVar7);
      std::__cxx11::string::~string(local_88);
      local_64 = iVar4;
      SetParallelLevel(this,iVar4);
      this->ParallelLevelSetInCli = true;
    }
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--repeat-until-fail",(char *)0x0);
  if (bVar3) {
    uVar2 = *i;
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args);
    if (sVar10 - 1 <= uVar2) {
      std::__cxx11::string::operator=
                ((string *)arg.field_2._8_8_,"\'--repeat-until-fail\' requires an argument");
      this_local._7_1_ = false;
      goto LAB_00541533;
    }
    *i = *i + 1;
    local_98 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmSystemTools::StringToLong(pcVar7,&local_98);
    if (!bVar3) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load,
                     "\'--repeat-until-fail\' given non-integer value \'",pvVar5);
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load,"\'"
                    );
      std::__cxx11::string::operator=((string *)arg.field_2._8_8_,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&load);
      this_local._7_1_ = false;
      goto LAB_00541533;
    }
    this->RepeatTests = (int)local_98;
    if (1 < local_98) {
      this->RepeatUntilFail = true;
    }
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--test-load",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmSystemTools::StringToULong(pcVar7,&local_e0);
    if (bVar3) {
      SetTestLoad(this,local_e0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
      poVar9 = std::operator<<((ostream *)local_258,"Invalid value for \'Test Load\' : ");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      poVar9 = std::operator<<(poVar9,(string *)pvVar5);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x6d8,pcVar7,false);
      std::__cxx11::string::~string((string *)&timeout);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
    }
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--no-compress-output",(char *)0x0);
  if (bVar3) {
    this->CompressTestOutput = false;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--print-labels",(char *)0x0);
  if (bVar3) {
    this->PrintLabels = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--http1.0",(char *)0x0);
  if (bVar3) {
    this->UseHTTP10 = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--timeout",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    outputSize = (long)atof(pcVar7);
    this->GlobalTimeout = (double)outputSize;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--stop-time",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,*i);
    SetStopTime(this,pvVar5);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-C","--build-config");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    SetConfigType(this,pcVar7);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--debug",(char *)0x0);
  if (bVar3) {
    this->Debug = true;
    this->ShowLineNumbers = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--track",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,*i);
    std::__cxx11::string::operator=((string *)&this->SpecificTrack,(string *)pvVar5);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--show-line-numbers",(char *)0x0);
  if (bVar3) {
    this->ShowLineNumbers = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--no-label-summary",(char *)0x0);
  if (bVar3) {
    this->LabelSummary = false;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--no-subproject-summary",(char *)0x0);
  if (bVar3) {
    this->SubprojectSummary = false;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-Q","--quiet");
  if (bVar3) {
    this->Quiet = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-V","--verbose");
  if (bVar3) {
    this->Verbose = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-B",(char *)0x0);
  if (bVar3) {
    this->BatchJobs = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-VV","--extra-verbose");
  if (bVar3) {
    this->ExtraVerbose = true;
    this->Verbose = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--output-on-failure",(char *)0x0);
  if (bVar3) {
    this->OutputTestOutputOnTestFailure = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--test-output-size-passed",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmSystemTools::StringToLong(pcVar7,(long *)&pCTestTestHandler);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,"test",&local_2b1);
      ppcVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                ::operator[](&this->TestingHandlers,&local_2b0);
      pcVar1 = (cmCTestTestHandler *)*ppcVar8;
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      local_290 = pcVar1;
      if (pcVar1 != (cmCTestTestHandler *)0x0) {
        cmCTestTestHandler::SetTestOutputSizePassed(pcVar1,(int)pCTestTestHandler);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
      poVar9 = std::operator<<((ostream *)local_430,
                               "Invalid value for \'--test-output-size-passed\': ");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      poVar9 = std::operator<<(poVar9,(string *)pvVar5);
      std::operator<<(poVar9,"\n");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x726,pcVar7,false);
      std::__cxx11::string::~string((string *)&outputSize_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
    }
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--test-output-size-failed",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmSystemTools::StringToLong(pcVar7,(long *)&pCTestTestHandler_1);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_480,"test",&local_481);
      ppcVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                ::operator[](&this->TestingHandlers,&local_480);
      pcVar1 = (cmCTestTestHandler *)*ppcVar8;
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator((allocator<char> *)&local_481);
      local_460 = pcVar1;
      if (pcVar1 != (cmCTestTestHandler *)0x0) {
        cmCTestTestHandler::SetTestOutputSizeFailed(pcVar1,(int)pCTestTestHandler_1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_600);
      poVar9 = std::operator<<((ostream *)local_600,
                               "Invalid value for \'--test-output-size-failed\': ");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      poVar9 = std::operator<<(poVar9,(string *)pvVar5);
      std::operator<<(poVar9,"\n");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x735,pcVar7,false);
      std::__cxx11::string::~string(local_620);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_600);
    }
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-N","--show-only");
  if (bVar3) {
    this->ShowOnly = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-O","--output-log");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    SetOutputLogFileName(this,pcVar7);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--tomorrow-tag",(char *)0x0);
  if (bVar3) {
    this->TomorrowTag = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--force-new-ctest-process",(char *)0x0);
  if (bVar3) {
    this->ForceNewCTestProcess = true;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-W","--max-width");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar4 = atoi(pcVar7);
    this->MaxTestNameWidth = iVar4;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--interactive-debug-mode",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmSystemTools::IsOn(pcVar7);
    this->InteractiveDebugMode = bVar3;
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--submit-index",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar4 = atoi(pcVar7);
    this->SubmitIndex = iVar4;
    if (this->SubmitIndex < 0) {
      this->SubmitIndex = 0;
    }
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--overwrite",(char *)0x0);
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,*i);
    AddCTestConfigurationOverwrite(this,pvVar5);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-A","--add-notes");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    this->ProduceXML = true;
    SetTest(this,"Notes",true);
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    SetNotesFiles(this,pcVar7);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-I","--tests-information");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_640,"TestsToRunInformation",&local_641);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_640,pcVar7);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_668,"TestsToRunInformation",&local_669);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_668,pcVar7);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator((allocator<char> *)&local_669);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-U","--union");
  if (bVar3) {
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_690,"UseUnion",&local_691);
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_690,"true");
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator((allocator<char> *)&local_691);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b8,"UseUnion",&local_6b9);
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_6b8,"true");
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-R","--tests-regex");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6e0,"IncludeRegularExpression",&local_6e1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_6e0,pcVar7);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_708,"IncludeRegularExpression",&local_709);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_708,pcVar7);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-L","--label-regex");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_730,"LabelRegularExpression",&local_731);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_730,pcVar7);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_758,"LabelRegularExpression",&local_759);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_758,pcVar7);
    std::__cxx11::string::~string((string *)&local_758);
    std::allocator<char>::~allocator((allocator<char> *)&local_759);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-LE","--label-exclude");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_780,"ExcludeLabelRegularExpression",&local_781);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_780,pcVar7);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7a8,"ExcludeLabelRegularExpression",&local_7a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_7a8,pcVar7);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-E","--exclude-regex");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7d0,"ExcludeRegularExpression",&local_7d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_7d0,pcVar7);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7f8,"ExcludeRegularExpression",&local_7f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_7f8,pcVar7);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-FA","--fixture-exclude-any");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_820,"ExcludeFixtureRegularExpression",&local_821);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_820,pcVar7);
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator((allocator<char> *)&local_821);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_848,"ExcludeFixtureRegularExpression",&local_849);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_848,pcVar7);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator((allocator<char> *)&local_849);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-FS","--fixture-exclude-setup");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_870,"ExcludeFixtureSetupRegularExpression",&local_871);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_870,pcVar7);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator((allocator<char> *)&local_871);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_898,"ExcludeFixtureSetupRegularExpression",&local_899);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_898,pcVar7);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator((allocator<char> *)&local_899);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"-FC","--fixture-exclude-cleanup");
  if ((bVar3) &&
     (uVar2 = *i,
     sVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar2 < sVar10 - 1)) {
    *i = *i + 1;
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_8c0,"ExcludeFixtureCleanupRegularExpression",&local_8c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_8c0,pcVar7);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_8e8,"ExcludeFixtureCleanupRegularExpression",&local_8e9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_8e8,pcVar7);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  }
  bVar3 = CheckArgument(this,(string *)local_50,"--rerun-failed",(char *)0x0);
  if (bVar3) {
    pcVar11 = GetHandler(this,"test");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_910,"RerunFailed",&local_911);
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_910,"true");
    std::__cxx11::string::~string((string *)&local_910);
    std::allocator<char>::~allocator((allocator<char> *)&local_911);
    pcVar11 = GetHandler(this,"memcheck");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_938,"RerunFailed",&local_939);
    cmCTestGenericHandler::SetPersistentOption(pcVar11,&local_938,"true");
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator((allocator<char> *)&local_939);
  }
  this_local._7_1_ = true;
LAB_00541533:
  repeat._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmCTest::HandleCommandLineArguments(size_t& i,
                                         std::vector<std::string>& args,
                                         std::string& errormsg)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-F")) {
    this->Failover = true;
  }
  if (this->CheckArgument(arg, "-j", "--parallel") && i < args.size() - 1) {
    i++;
    int plevel = atoi(args[i].c_str());
    this->SetParallelLevel(plevel);
    this->ParallelLevelSetInCli = true;
  } else if (arg.find("-j") == 0) {
    int plevel = atoi(arg.substr(2).c_str());
    this->SetParallelLevel(plevel);
    this->ParallelLevelSetInCli = true;
  }
  if (this->CheckArgument(arg, "--repeat-until-fail")) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat-until-fail' requires an argument";
      return false;
    }
    i++;
    long repeat = 1;
    if (!cmSystemTools::StringToLong(args[i].c_str(), &repeat)) {
      errormsg =
        "'--repeat-until-fail' given non-integer value '" + args[i] + "'";
      return false;
    }
    this->RepeatTests = static_cast<int>(repeat);
    if (repeat > 1) {
      this->RepeatUntilFail = true;
    }
  }

  if (this->CheckArgument(arg, "--test-load") && i < args.size() - 1) {
    i++;
    unsigned long load;
    if (cmSystemTools::StringToULong(args[i].c_str(), &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << args[i] << std::endl);
    }
  }

  if (this->CheckArgument(arg, "--no-compress-output")) {
    this->CompressTestOutput = false;
  }

  if (this->CheckArgument(arg, "--print-labels")) {
    this->PrintLabels = true;
  }

  if (this->CheckArgument(arg, "--http1.0")) {
    this->UseHTTP10 = true;
  }

  if (this->CheckArgument(arg, "--timeout") && i < args.size() - 1) {
    i++;
    double timeout = (double)atof(args[i].c_str());
    this->GlobalTimeout = timeout;
  }

  if (this->CheckArgument(arg, "--stop-time") && i < args.size() - 1) {
    i++;
    this->SetStopTime(args[i]);
  }

  if (this->CheckArgument(arg, "-C", "--build-config") &&
      i < args.size() - 1) {
    i++;
    this->SetConfigType(args[i].c_str());
  }

  if (this->CheckArgument(arg, "--debug")) {
    this->Debug = true;
    this->ShowLineNumbers = true;
  }
  if (this->CheckArgument(arg, "--track") && i < args.size() - 1) {
    i++;
    this->SpecificTrack = args[i];
  }
  if (this->CheckArgument(arg, "--show-line-numbers")) {
    this->ShowLineNumbers = true;
  }
  if (this->CheckArgument(arg, "--no-label-summary")) {
    this->LabelSummary = false;
  }
  if (this->CheckArgument(arg, "--no-subproject-summary")) {
    this->SubprojectSummary = false;
  }
  if (this->CheckArgument(arg, "-Q", "--quiet")) {
    this->Quiet = true;
  }
  if (this->CheckArgument(arg, "-V", "--verbose")) {
    this->Verbose = true;
  }
  if (this->CheckArgument(arg, "-B")) {
    this->BatchJobs = true;
  }
  if (this->CheckArgument(arg, "-VV", "--extra-verbose")) {
    this->ExtraVerbose = true;
    this->Verbose = true;
  }
  if (this->CheckArgument(arg, "--output-on-failure")) {
    this->OutputTestOutputOnTestFailure = true;
  }
  if (this->CheckArgument(arg, "--test-output-size-passed") &&
      i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmSystemTools::StringToLong(args[i].c_str(), &outputSize)) {
      if (cmCTestTestHandler* pCTestTestHandler =
            static_cast<cmCTestTestHandler*>(this->TestingHandlers["test"])) {
        pCTestTestHandler->SetTestOutputSizePassed(int(outputSize));
      }
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-passed': " << args[i]
                                                                   << "\n");
    }
  }
  if (this->CheckArgument(arg, "--test-output-size-failed") &&
      i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmSystemTools::StringToLong(args[i].c_str(), &outputSize)) {
      if (cmCTestTestHandler* pCTestTestHandler =
            static_cast<cmCTestTestHandler*>(this->TestingHandlers["test"])) {
        pCTestTestHandler->SetTestOutputSizeFailed(int(outputSize));
      }
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-failed': " << args[i]
                                                                   << "\n");
    }
  }
  if (this->CheckArgument(arg, "-N", "--show-only")) {
    this->ShowOnly = true;
  }

  if (this->CheckArgument(arg, "-O", "--output-log") && i < args.size() - 1) {
    i++;
    this->SetOutputLogFileName(args[i].c_str());
  }

  if (this->CheckArgument(arg, "--tomorrow-tag")) {
    this->TomorrowTag = true;
  }
  if (this->CheckArgument(arg, "--force-new-ctest-process")) {
    this->ForceNewCTestProcess = true;
  }
  if (this->CheckArgument(arg, "-W", "--max-width") && i < args.size() - 1) {
    i++;
    this->MaxTestNameWidth = atoi(args[i].c_str());
  }
  if (this->CheckArgument(arg, "--interactive-debug-mode") &&
      i < args.size() - 1) {
    i++;
    this->InteractiveDebugMode = cmSystemTools::IsOn(args[i].c_str());
  }
  if (this->CheckArgument(arg, "--submit-index") && i < args.size() - 1) {
    i++;
    this->SubmitIndex = atoi(args[i].c_str());
    if (this->SubmitIndex < 0) {
      this->SubmitIndex = 0;
    }
  }

  if (this->CheckArgument(arg, "--overwrite") && i < args.size() - 1) {
    i++;
    this->AddCTestConfigurationOverwrite(args[i]);
  }
  if (this->CheckArgument(arg, "-A", "--add-notes") && i < args.size() - 1) {
    this->ProduceXML = true;
    this->SetTest("Notes");
    i++;
    this->SetNotesFiles(args[i].c_str());
  }

  // options that control what tests are run
  if (this->CheckArgument(arg, "-I", "--tests-information") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("TestsToRunInformation",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("TestsToRunInformation", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-U", "--union")) {
    this->GetHandler("test")->SetPersistentOption("UseUnion", "true");
    this->GetHandler("memcheck")->SetPersistentOption("UseUnion", "true");
  }
  if (this->CheckArgument(arg, "-R", "--tests-regex") && i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("IncludeRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("IncludeRegularExpression", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-L", "--label-regex") && i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("LabelRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("LabelRegularExpression", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-LE", "--label-exclude") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeLabelRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeLabelRegularExpression", args[i].c_str());
  }

  if (this->CheckArgument(arg, "-E", "--exclude-regex") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("ExcludeRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeRegularExpression", args[i].c_str());
  }

  if (this->CheckArgument(arg, "-FA", "--fixture-exclude-any") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureRegularExpression",
                            args[i].c_str());
  }
  if (this->CheckArgument(arg, "-FS", "--fixture-exclude-setup") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureSetupRegularExpression",
                            args[i].c_str());
  }
  if (this->CheckArgument(arg, "-FC", "--fixture-exclude-cleanup") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureCleanupRegularExpression",
                            args[i].c_str());
  }

  if (this->CheckArgument(arg, "--rerun-failed")) {
    this->GetHandler("test")->SetPersistentOption("RerunFailed", "true");
    this->GetHandler("memcheck")->SetPersistentOption("RerunFailed", "true");
  }
  return true;
}